

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  id this;
  ostream *poVar2;
  runtime_error *prVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  bool flags [3];
  thread t2_2;
  thread t1_2;
  thread t3;
  thread t2;
  counted_functor f;
  recursive_mutex m_1;
  thread t1;
  thread t3_4;
  thread t;
  ostringstream oss;
  byte local_294;
  condition_variable cStack_293;
  byte local_292 [2];
  thread local_290;
  thread local_288;
  thread local_280;
  thread local_278;
  int local_270;
  undefined1 local_258 [16];
  condition_variable *local_248;
  shared_mutex *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined1 local_200 [16];
  condition_variable *local_1f0;
  shared_mutex *local_1e8;
  thread local_1e0;
  undefined1 local_1d8 [8];
  thread *ptStack_1d0;
  condition_variable *local_1c8;
  shared_mutex *psStack_1c0;
  undefined8 local_1b8;
  pthread_mutex_t local_1a8 [9];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test execution",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  if (called_ != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xcb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," !called_",9);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&local_238);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::thread::thread<void(&)(),,void>((thread *)local_1d8,caller);
  std::thread::join();
  if (called_ == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xce);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," called_",8);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&local_238);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_1d8 == (undefined1  [8])0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Functor destruction",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    if (counted_functor::objects != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xd2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," counted_functor::objects==0",0x1c)
      ;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)&local_238);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1a8[0].__align = &counted_functor::lock;
    local_1a8[0]._8_8_ = local_1a8[0]._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1a8);
    local_1a8[0]._8_1_ = 1;
    counted_functor::objects = counted_functor::objects + 1;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1a8);
    std::thread::thread<counted_functor&,,void>((thread *)local_1d8,(counted_functor *)local_258);
    if (counted_functor::objects < 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xd6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," counted_functor::objects>=2",0x1c)
      ;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)&local_238);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::thread::join();
    if (counted_functor::objects != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xd8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," counted_functor::objects==1",0x1c)
      ;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)&local_238);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_1d8 == (undefined1  [8])0x0) {
      counted_functor::~counted_functor((counted_functor *)local_258);
      if (counted_functor::objects != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xda);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," counted_functor::objects==0",0x1c);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)&local_238);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1a8[0].__align = &counted_functor::lock;
      local_1a8[0]._8_8_ = local_1a8[0]._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1a8);
      local_1a8[0]._8_1_ = 1;
      counted_functor::objects = counted_functor::objects + 1;
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1a8);
      std::thread::thread<counted_functor&,,void>((thread *)local_1d8,(counted_functor *)local_258);
      if (counted_functor::objects < 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xdf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," counted_functor::objects>=2",0x1c);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)&local_238);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::thread::detach();
      if (local_1d8 == (undefined1  [8])0x0) {
        counted_functor::~counted_functor((counted_functor *)local_258);
        if (counted_functor::objects < 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xe2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," counted_functor::objects>=1",0x1c);
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar3,(string *)&local_238);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        booster::ptime::millisleep(400);
        if (counted_functor::objects != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xe4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," counted_functor::objects==0",0x1c);
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar3,(string *)&local_238);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Test recursive mutex",0x14);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        local_1a8[0].__data.__list.__prev = (__pthread_internal_list *)0x0;
        local_1a8[0].__align = (condition_variable *)0x0;
        local_1a8[0]._8_8_ = 0;
        local_1a8[0].__data.__list.__next = (__pthread_internal_list *)0x0;
        local_1a8[0]._16_8_ = 1;
        iVar1 = pthread_mutex_lock(local_1a8);
        if (iVar1 == 0) {
          iVar1 = pthread_mutex_lock(local_1a8);
          if (iVar1 == 0) {
            pthread_mutex_unlock(local_1a8);
            pthread_mutex_unlock(local_1a8);
            variable = 0;
            uStack_220 = 0;
            local_238 = 0;
            uStack_230 = 0;
            local_218 = 0;
            local_228 = 1;
            local_258._0_8_ = (condition_variable *)&local_238;
            std::thread::thread<incrementer<std::recursive_mutex>&,,void>
                      ((thread *)local_200,(incrementer<std::recursive_mutex> *)local_258);
            std::thread::thread<incrementer<std::recursive_mutex>&,,void>
                      (&local_278,(incrementer<std::recursive_mutex> *)local_258);
            std::thread::join();
            std::thread::join();
            if (variable != 10) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xfa);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2," variable == 10",0xf);
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar3,(string *)local_1d8);
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            if ((local_278._M_id._M_thread == 0) && (local_200._0_8_ == 0)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Test mutex",10);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
              std::ostream::put('\b');
              std::ostream::flush();
              variable = 0;
              local_228 = 0;
              uStack_220 = 0;
              local_238 = 0;
              uStack_230 = 0;
              local_218 = 0;
              local_258._0_8_ = (condition_variable *)&local_238;
              std::thread::thread<incrementer<std::mutex>&,,void>
                        ((thread *)local_200,(incrementer<std::mutex> *)local_258);
              std::thread::thread<incrementer<std::mutex>&,,void>
                        (&local_278,(incrementer<std::mutex> *)local_258);
              std::thread::join();
              std::thread::join();
              if (variable != 10) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                           ,0x70);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x105);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2," variable == 10",0xf);
                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar3,(string *)local_1d8);
                __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              if ((local_278._M_id._M_thread == 0) && (local_200._0_8_ == 0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Test thread specific",0x14);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                std::ostream::put('\b');
                std::ostream::flush();
                booster::details::make_key((_func_void_void_ptr *)local_1d8);
                local_278._M_id._M_thread = (id)(id)local_1d8;
                local_258._0_8_ = local_1d8;
                local_200._0_8_ = local_1d8;
                std::thread::thread<tls_functor&,,void>(&local_288,(tls_functor *)local_258);
                std::thread::thread<tls_functor&,,void>(&local_290,(tls_functor *)local_200);
                std::thread::thread<tls_functor&,,void>(&local_280,(tls_functor *)&local_278);
                std::thread::join();
                std::thread::join();
                std::thread::join();
                if (tls_ok == false) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Error ",6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                             ,0x70);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x115);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2," tls_ok",7);
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar3,(string *)&local_238);
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                if (dtor_called != 3) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Error ",6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                             ,0x70);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x116);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar2," dtor_called == 3",0x11);
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar3,(string *)&local_238);
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                if (((CONCAT44(local_280._M_id._M_thread._4_4_,(uint)local_280._M_id._M_thread) == 0
                     ) && (CONCAT71(local_290._M_id._M_thread._1_7_,(char)local_290._M_id._M_thread)
                           == 0)) && (local_288._M_id._M_thread == 0)) {
                  booster::intrusive_ptr<booster::details::key>::~intrusive_ptr
                            ((intrusive_ptr<booster::details::key> *)local_1d8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Non synchronous thread specific",0x1f);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                  std::ostream::put('\b');
                  std::ostream::flush();
                  dtor_called = 0;
                  this._M_thread = (native_handle_type)operator_new(8);
                  booster::details::make_key((_func_void_void_ptr *)this._M_thread);
                  local_258._0_8_ = this._M_thread;
                  local_200._0_8_ = this._M_thread;
                  local_1d8 = (undefined1  [8])this._M_thread;
                  std::thread::thread<tls_functor2&,,void>(&local_278,(tls_functor2 *)local_1d8);
                  std::thread::thread<tls_functor2&,,void>(&local_288,(tls_functor2 *)local_258);
                  std::thread::thread<tls_functor2&,,void>(&local_290,(tls_functor2 *)local_200);
                  booster::ptime::millisleep(300);
                  booster::intrusive_ptr<booster::details::key>::~intrusive_ptr
                            ((intrusive_ptr<booster::details::key> *)this._M_thread);
                  operator_delete((void *)this._M_thread);
                  std::thread::join();
                  std::thread::join();
                  std::thread::join();
                  if (dtor_called != 3) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"Error ",6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                               ,0x70);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,300);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar2," dtor_called == 3",0x11);
                    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    std::runtime_error::runtime_error(prVar3,(string *)&local_238);
                    __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  if (((CONCAT71(local_290._M_id._M_thread._1_7_,(char)local_290._M_id._M_thread) ==
                        0) && (local_288._M_id._M_thread == 0)) && (local_278._M_id._M_thread == 0))
                  {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Thest conditional variable notify one",0x25);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                    std::ostream::put('\b');
                    std::ostream::flush();
                    local_280._M_id._M_thread._0_4_ = 0;
                    local_1c8 = (condition_variable *)0x0;
                    psStack_1c0 = (shared_mutex *)0x0;
                    local_1d8 = (undefined1  [8])0x0;
                    ptStack_1d0 = (thread *)0x0;
                    local_1b8 = 0;
                    std::condition_variable::condition_variable((condition_variable *)&local_238);
                    local_200._0_8_ = &local_280;
                    local_200._8_8_ = (mutex *)local_1d8;
                    local_1f0 = (condition_variable *)&local_238;
                    std::thread::thread<cond_incrementer&,,void>
                              (&local_278,(cond_incrementer *)local_200);
                    std::thread::thread<cond_incrementer&,,void>
                              (&local_288,(cond_incrementer *)local_200);
                    std::thread::thread<cond_incrementer&,,void>
                              (&local_290,(cond_incrementer *)local_200);
                    booster::ptime::millisleep(100);
                    if ((uint)local_280._M_id._M_thread != 0) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"Error ",6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                 ,0x70);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                      ;
                      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x138);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar2," counter == 0",0xd)
                      ;
                      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::stringbuf::str();
                      std::runtime_error::runtime_error(prVar3,(string *)local_258);
                      __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    std::condition_variable::notify_one();
                    booster::ptime::millisleep(100);
                    if ((uint)local_280._M_id._M_thread != 1) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"Error ",6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                 ,0x70);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                      ;
                      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x13b);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar2," counter == 1",0xd)
                      ;
                      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::stringbuf::str();
                      std::runtime_error::runtime_error(prVar3,(string *)local_258);
                      __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    std::condition_variable::notify_one();
                    booster::ptime::millisleep(100);
                    if ((uint)local_280._M_id._M_thread != 2) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"Error ",6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                 ,0x70);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                      ;
                      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x13e);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar2," counter == 2",0xd)
                      ;
                      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::stringbuf::str();
                      std::runtime_error::runtime_error(prVar3,(string *)local_258);
                      __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    std::condition_variable::notify_one();
                    booster::ptime::millisleep(100);
                    if ((uint)local_280._M_id._M_thread != 3) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"Error ",6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                 ,0x70);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                      ;
                      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x141);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar2," counter == 3",0xd)
                      ;
                      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::stringbuf::str();
                      std::runtime_error::runtime_error(prVar3,(string *)local_258);
                      __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    std::thread::join();
                    std::thread::join();
                    std::thread::join();
                    if (((CONCAT71(local_290._M_id._M_thread._1_7_,(char)local_290._M_id._M_thread)
                          == 0) && (local_288._M_id._M_thread == 0)) &&
                       (local_278._M_id._M_thread == 0)) {
                      std::condition_variable::~condition_variable((condition_variable *)&local_238)
                      ;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Thest conditional variable notify all",0x25)
                      ;
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                      std::ostream::put('\b');
                      std::ostream::flush();
                      local_278._M_id._M_thread = (id)0;
                      local_270 = 0;
                      local_1b8 = 0;
                      local_1c8 = (condition_variable *)0x0;
                      psStack_1c0 = (shared_mutex *)0x0;
                      local_1d8 = (undefined1  [8])0x0;
                      ptStack_1d0 = (thread *)0x0;
                      std::condition_variable::condition_variable((condition_variable *)&local_238);
                      local_200._0_8_ = &local_278;
                      local_200._8_8_ = (mutex *)local_1d8;
                      local_1f0 = (condition_variable *)&local_238;
                      std::thread::thread<cond_incrementer&,,void>
                                (&local_288,(cond_incrementer *)local_200);
                      local_200._0_8_ = local_200._0_8_ + 4;
                      std::thread::thread<cond_incrementer&,,void>
                                (&local_290,(cond_incrementer *)local_200);
                      local_200._0_8_ = local_200._0_8_ + 4;
                      std::thread::thread<cond_incrementer&,,void>
                                (&local_280,(cond_incrementer *)local_200);
                      booster::ptime::millisleep(100);
                      if ((((int)local_278._M_id._M_thread != 0) ||
                          (local_278._M_id._M_thread._4_4_ != 0)) || (local_270 != 0)) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"Error ",6);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                   ,0x70);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,":",1);
                        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x152);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar2," counter[0]==0 && counter[1]==0 && counter[2]==0",0x30);
                        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar3,(string *)local_258);
                        __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      std::condition_variable::notify_all();
                      booster::ptime::millisleep(100);
                      if ((((int)local_278._M_id._M_thread != 1) ||
                          (local_278._M_id._M_thread._4_4_ != 1)) || (local_270 != 1)) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"Error ",6);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                   ,0x70);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,":",1);
                        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x155);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar2," counter[0]==1 && counter[1]==1 && counter[2]==1",0x30);
                        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar3,(string *)local_258);
                        __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      std::thread::join();
                      std::thread::join();
                      std::thread::join();
                      if (((CONCAT44(local_280._M_id._M_thread._4_4_,(uint)local_280._M_id._M_thread
                                    ) == 0) &&
                          (CONCAT71(local_290._M_id._M_thread._1_7_,(char)local_290._M_id._M_thread)
                           == 0)) && (local_288._M_id._M_thread == 0)) {
                        std::condition_variable::~condition_variable
                                  ((condition_variable *)&local_238);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"Test shared_mutex write lock",0x1c);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                        std::ostream::put('\b');
                        std::ostream::flush();
                        variable = 0;
                        booster::shared_mutex::shared_mutex((shared_mutex *)local_1d8);
                        local_258._0_8_ = (shared_mutex *)local_1d8;
                        std::thread::thread<incrementer<booster::shared_mutex>&,,void>
                                  ((thread *)local_200,
                                   (incrementer<booster::shared_mutex> *)local_258);
                        std::thread::thread<incrementer<booster::shared_mutex>&,,void>
                                  (&local_278,(incrementer<booster::shared_mutex> *)local_258);
                        std::thread::join();
                        std::thread::join();
                        if (variable != 10) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,"Error ",6);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                     ,0x70);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,":",1);
                          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x163);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar2," variable == 10",0xf);
                          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::__cxx11::stringbuf::str();
                          std::runtime_error::runtime_error(prVar3,(string *)&local_238);
                          __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        if ((local_278._M_id._M_thread == 0) && (local_200._0_8_ == 0)) {
                          booster::shared_mutex::~shared_mutex((shared_mutex *)local_1d8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"Test recursive_shared_mutex write lock",
                                     0x26);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                          std::ostream::put('\b');
                          std::ostream::flush();
                          variable = 0;
                          booster::shared_mutex::shared_mutex((shared_mutex *)local_1d8);
                          local_258._0_8_ = (shared_mutex *)local_1d8;
                          std::thread::thread<incrementer<booster::shared_mutex>&,,void>
                                    ((thread *)local_200,
                                     (incrementer<booster::shared_mutex> *)local_258);
                          std::thread::thread<incrementer<booster::shared_mutex>&,,void>
                                    (&local_278,(incrementer<booster::shared_mutex> *)local_258);
                          std::thread::join();
                          std::thread::join();
                          if (variable != 10) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,"Error ",6);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                       ,0x70);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,":",1);
                            poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x16e)
                            ;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar2," variable == 10",0xf);
                            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::__cxx11::stringbuf::str();
                            std::runtime_error::runtime_error(prVar3,(string *)&local_238);
                            __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          if ((local_278._M_id._M_thread == 0) && (local_200._0_8_ == 0)) {
                            booster::shared_mutex::~shared_mutex((shared_mutex *)local_1d8);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"Test shared_mutex shared/write lock",
                                       0x23);
                            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                            std::ostream::put('\b');
                            std::ostream::flush();
                            local_228 = 0;
                            uStack_220 = 0;
                            local_238 = 0;
                            uStack_230 = 0;
                            local_218 = 0;
                            booster::shared_mutex::shared_mutex((shared_mutex *)&local_288);
                            local_200._0_8_ = local_292;
                            local_292[0] = 0;
                            _local_294 = 0;
                            local_1d8 = (undefined1  [8])&local_294;
                            ptStack_1d0 = (thread *)CONCAT71(ptStack_1d0._1_7_,1);
                            local_258._0_8_ = &cStack_293;
                            local_258[8] = 1;
                            local_200[8] = 1;
                            local_248 = (condition_variable *)&local_238;
                            local_240 = (shared_mutex *)&local_288;
                            local_1f0 = (condition_variable *)&local_238;
                            local_1e8 = (shared_mutex *)&local_288;
                            local_1c8 = (condition_variable *)&local_238;
                            psStack_1c0 = (shared_mutex *)&local_288;
                            std::thread::thread<rw_executor<booster::shared_mutex>&,,void>
                                      (&local_290,(rw_executor<booster::shared_mutex> *)local_1d8);
                            std::thread::thread<rw_executor<booster::shared_mutex>&,,void>
                                      (&local_280,(rw_executor<booster::shared_mutex> *)local_258);
                            std::thread::thread<rw_executor<booster::shared_mutex>&,,void>
                                      (&local_1e0,(rw_executor<booster::shared_mutex> *)local_200);
                            iVar1 = 100;
                            bVar4 = 0;
                            bVar5 = 0;
                            bVar6 = 0;
                            do {
                              booster::ptime::millisleep(1);
                              local_1a8[0]._8_8_ = local_1a8[0]._8_8_ & 0xffffffffffffff00;
                              local_1a8[0]._0_8_ = (condition_variable *)&local_238;
                              std::unique_lock<std::mutex>::lock
                                        ((unique_lock<std::mutex> *)local_1a8);
                              local_1a8[0]._8_1_ = 1;
                              bVar6 = bVar6 | local_294 & (byte)cStack_293;
                              bVar5 = bVar5 | local_292[0];
                              bVar4 = bVar4 | (local_294 | (byte)cStack_293) & local_292[0];
                              std::unique_lock<std::mutex>::~unique_lock
                                        ((unique_lock<std::mutex> *)local_1a8);
                              iVar1 = iVar1 + -1;
                            } while (iVar1 != 0);
                            std::thread::join();
                            std::thread::join();
                            std::thread::join();
                            if ((bVar6 & 1) == 0) {
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,"Error ",6);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                         ,0x70);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,":",1);
                              poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,400)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar2," mread_happened",0xf);
                              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::__cxx11::stringbuf::str();
                              std::runtime_error::runtime_error(prVar3,(string *)&local_278);
                              __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            if ((bVar5 & 1) == 0) {
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,"Error ",6);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                         ,0x70);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,":",1);
                              poVar2 = (ostream *)
                                       std::ostream::operator<<((ostream *)local_1a8,0x191);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar2," write_happened",0xf);
                              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::__cxx11::stringbuf::str();
                              std::runtime_error::runtime_error(prVar3,(string *)&local_278);
                              __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            if ((bVar4 & 1) == 0) {
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,"Error ",6);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                         ,0x70);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,":",1);
                              poVar2 = (ostream *)
                                       std::ostream::operator<<((ostream *)local_1a8,0x192);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar2," error_occured",0xe);
                              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::__cxx11::stringbuf::str();
                              std::runtime_error::runtime_error(prVar3,(string *)&local_278);
                              __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            if (((local_1e0._M_id._M_thread == 0) &&
                                (CONCAT44(local_280._M_id._M_thread._4_4_,
                                          (uint)local_280._M_id._M_thread) == 0)) &&
                               (CONCAT71(local_290._M_id._M_thread._1_7_,
                                         (char)local_290._M_id._M_thread) == 0)) {
                              booster::shared_mutex::~shared_mutex((shared_mutex *)&local_288);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "Test recursive_shared_mutex shared/write lock",0x2d);
                              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                              std::ostream::put('\b');
                              std::ostream::flush();
                              local_228 = 0;
                              uStack_220 = 0;
                              local_238 = 0;
                              uStack_230 = 0;
                              local_218 = 0;
                              booster::recursive_shared_mutex::recursive_shared_mutex
                                        ((recursive_shared_mutex *)&local_288);
                              local_292[0] = 0;
                              _local_294 = 0;
                              local_1d8 = (undefined1  [8])&local_294;
                              ptStack_1d0 = (thread *)CONCAT71(ptStack_1d0._1_7_,1);
                              local_258._0_8_ = &cStack_293;
                              local_258[8] = 1;
                              local_200._0_8_ = local_292;
                              local_200[8] = 1;
                              local_248 = (condition_variable *)&local_238;
                              local_240 = (shared_mutex *)&local_288;
                              local_1f0 = (condition_variable *)&local_238;
                              local_1e8 = (shared_mutex *)&local_288;
                              local_1c8 = (condition_variable *)&local_238;
                              psStack_1c0 = (shared_mutex *)&local_288;
                              std::thread::
                              thread<rw_executor<booster::recursive_shared_mutex>&,,void>
                                        (&local_290,
                                         (rw_executor<booster::recursive_shared_mutex> *)local_1d8);
                              std::thread::
                              thread<rw_executor<booster::recursive_shared_mutex>&,,void>
                                        (&local_280,
                                         (rw_executor<booster::recursive_shared_mutex> *)local_258);
                              std::thread::
                              thread<rw_executor<booster::recursive_shared_mutex>&,,void>
                                        (&local_1e0,
                                         (rw_executor<booster::recursive_shared_mutex> *)local_200);
                              iVar1 = 100;
                              bVar4 = 0;
                              bVar5 = 0;
                              bVar6 = 0;
                              do {
                                booster::ptime::millisleep(1);
                                local_1a8[0]._8_8_ = local_1a8[0]._8_8_ & 0xffffffffffffff00;
                                local_1a8[0]._0_8_ = (condition_variable *)&local_238;
                                std::unique_lock<std::mutex>::lock
                                          ((unique_lock<std::mutex> *)local_1a8);
                                local_1a8[0]._8_1_ = 1;
                                bVar6 = bVar6 | local_294 & (byte)cStack_293;
                                bVar5 = bVar5 | local_292[0];
                                bVar4 = bVar4 | (local_294 | (byte)cStack_293) & local_292[0];
                                std::unique_lock<std::mutex>::~unique_lock
                                          ((unique_lock<std::mutex> *)local_1a8);
                                iVar1 = iVar1 + -1;
                              } while (iVar1 != 0);
                              std::thread::join();
                              std::thread::join();
                              std::thread::join();
                              if ((bVar6 & 1) == 0) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1a8);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1a8,"Error ",6);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1a8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                           ,0x70);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1a8,":",1);
                                poVar2 = (ostream *)
                                         std::ostream::operator<<((ostream *)local_1a8,0x1b4);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar2," mread_happened",0xf);
                                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::__cxx11::stringbuf::str();
                                std::runtime_error::runtime_error(prVar3,(string *)&local_278);
                                __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              if ((bVar5 & 1) == 0) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1a8);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1a8,"Error ",6);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1a8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                           ,0x70);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1a8,":",1);
                                poVar2 = (ostream *)
                                         std::ostream::operator<<((ostream *)local_1a8,0x1b5);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar2," write_happened",0xf);
                                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::__cxx11::stringbuf::str();
                                std::runtime_error::runtime_error(prVar3,(string *)&local_278);
                                __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              if ((bVar4 & 1) == 0) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1a8);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1a8,"Error ",6);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1a8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                           ,0x70);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1a8,":",1);
                                poVar2 = (ostream *)
                                         std::ostream::operator<<((ostream *)local_1a8,0x1b6);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar2," error_occured",0xe);
                                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::__cxx11::stringbuf::str();
                                std::runtime_error::runtime_error(prVar3,(string *)&local_278);
                                __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              if (((local_1e0._M_id._M_thread == 0) &&
                                  (CONCAT44(local_280._M_id._M_thread._4_4_,
                                            (uint)local_280._M_id._M_thread) == 0)) &&
                                 (CONCAT71(local_290._M_id._M_thread._1_7_,
                                           (char)local_290._M_id._M_thread) == 0)) {
                                booster::recursive_shared_mutex::~recursive_shared_mutex
                                          ((recursive_shared_mutex *)&local_288);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "Test recursive_shared_mutex recursive shared lock",0x31)
                                ;
                                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                                std::ostream::put('\b');
                                std::ostream::flush();
                                booster::recursive_shared_mutex::recursive_shared_mutex
                                          ((recursive_shared_mutex *)local_200);
                                local_290._M_id._M_thread._0_1_ = '\0';
                                local_280._M_id._M_thread._0_4_ =
                                     (uint)local_280._M_id._M_thread & 0xffffff00;
                                local_258._0_8_ = local_200;
                                local_258._8_8_ = &local_280;
                                local_1d8 = (undefined1  [8])local_200;
                                ptStack_1d0 = &local_290;
                                std::thread::thread<rw_shared_thread&,,void>
                                          (&local_278,(rw_shared_thread *)local_1d8);
                                std::thread::thread<rw_unique_thread&,,void>
                                          (&local_288,(rw_unique_thread *)local_258);
                                std::thread::join();
                                std::thread::join();
                                if ((char)local_290._M_id._M_thread == '\0') {
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_1a8);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,"Error ",6);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                             ,0x70);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,":",1);
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)local_1a8,0x1c3);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar2," read",5);
                                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::__cxx11::stringbuf::str();
                                  std::runtime_error::runtime_error(prVar3,(string *)&local_238);
                                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                if ((char)local_280._M_id._M_thread == '\0') {
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_1a8);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,"Error ",6);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                                             ,0x70);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,":",1);
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)local_1a8,0x1c4);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar2," write",6);
                                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::__cxx11::stringbuf::str();
                                  std::runtime_error::runtime_error(prVar3,(string *)&local_238);
                                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                if ((local_288._M_id._M_thread == 0) &&
                                   (local_278._M_id._M_thread == 0)) {
                                  booster::recursive_shared_mutex::~recursive_shared_mutex
                                            ((recursive_shared_mutex *)local_200);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"Ok",2);
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                                  std::ostream::put('\b');
                                  std::ostream::flush();
                                  return 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_001084af;
          }
        }
        std::__throw_system_error(iVar1);
      }
    }
  }
LAB_001084af:
  std::terminate();
}

Assistant:

int main()
{
	try {
		{
			std::cout << "Test execution" << std::endl;
			TEST(!called_);
			booster::thread t(caller);
			t.join();
			TEST(called_);
		}
		{
			std::cout << "Functor destruction" << std::endl;
			TEST(counted_functor::objects==0);
			{
				counted_functor f;
				booster::thread t(f);
				TEST(counted_functor::objects>=2);
				t.join();
				TEST(counted_functor::objects==1);
			}
			TEST(counted_functor::objects==0);
			{
				{
                    counted_functor f;
                    booster::thread t(f);
                    TEST(counted_functor::objects>=2);
                    t.detach();
                }
				TEST(counted_functor::objects>=1);
                booster::ptime::millisleep(400);
                TEST(counted_functor::objects==0);
			}
			
		}
		std::cout << "Test recursive mutex" << std::endl;
		{
			booster::recursive_mutex m;
			m.lock();
			m.lock();
			TEST("Double lock works");
			m.unlock();
			m.unlock();
			TEST("Got there");
		}
		{
			variable = 0;
			booster::recursive_mutex m;
			incrementer<booster::recursive_mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test mutex" << std::endl;
		{
			variable = 0;
			booster::mutex m;
			incrementer<booster::mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test thread specific" << std::endl;
		{
			booster::thread_specific_ptr<tls_object> p;
			tls_functor f1(p);
			tls_functor f2(p);
			tls_functor f3(p);
			booster::thread t1(f1);
			booster::thread t2(f2);
			booster::thread t3(f3);

			t1.join();
			t2.join();
			t3.join();

			TEST(tls_ok);
			TEST(dtor_called == 3);
		}
		std::cout << "Non synchronous thread specific" << std::endl;
		{
			dtor_called = 0;
			booster::thread_specific_ptr<tls_object> *p = new booster::thread_specific_ptr<tls_object>();
			
			tls_functor2 f1(*p);
			tls_functor2 f2(*p);
			tls_functor2 f3(*p);

			booster::thread t1(f1);
			booster::thread t2(f2);
			booster::thread t3(f3);

			booster::ptime::millisleep(300);
			delete p;
			
			t1.join();
			t2.join();
			t3.join();

			TEST(dtor_called == 3);
		}
		std::cout << "Thest conditional variable notify one" << std::endl;
		{
			int counter = 0;
			booster::mutex m;
			booster::condition_variable c;
			cond_incrementer inc = { &counter, &m , &c };
			booster::thread t1(inc);
			booster::thread t2(inc);
			booster::thread t3(inc);
			booster::ptime::millisleep(100);
			TEST(counter == 0);
			c.notify_one();
			booster::ptime::millisleep(100);
			TEST(counter == 1);
			c.notify_one();
			booster::ptime::millisleep(100);
			TEST(counter == 2);
			c.notify_one();
			booster::ptime::millisleep(100);
			TEST(counter == 3);
			t1.join();
			t2.join();
			t3.join();
		}
		std::cout << "Thest conditional variable notify all" << std::endl;
		{
			int counter[3] = { 0, 0 , 0 };
			booster::mutex m;
			booster::condition_variable c;
			cond_incrementer inc = { counter, &m , &c };
			booster::thread t1(inc);
			inc.counter++;
			booster::thread t2(inc);
			inc.counter++;
			booster::thread t3(inc);
			booster::ptime::millisleep(100);
			TEST(counter[0]==0 && counter[1]==0 && counter[2]==0);
			c.notify_all();
			booster::ptime::millisleep(100);
			TEST(counter[0]==1 && counter[1]==1 && counter[2]==1);
			t1.join();
			t2.join();
			t3.join();
		}
		std::cout << "Test shared_mutex write lock" << std::endl;
		{
			variable = 0;
			booster::shared_mutex m;
			incrementer<booster::shared_mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test recursive_shared_mutex write lock" << std::endl;
		{
			variable = 0;
			booster::shared_mutex m;
			incrementer<booster::shared_mutex> inc = { &m };
			booster::thread t1(inc);
			booster::thread t2(inc);
			t1.join();
			t2.join();
			TEST(variable == 10);
		}
		std::cout << "Test shared_mutex shared/write lock" << std::endl;
		{
			booster::mutex fm;
			booster::shared_mutex sm;
			bool flags[3] = {false,false,false};
			bool mread_happened  = false;
			bool write_happened = false;
			bool error_occured = false ;
			rw_executor<booster::shared_mutex> exec1 = { flags + 0, true, &fm, &sm };
			rw_executor<booster::shared_mutex> exec2 = { flags + 1, true, &fm, &sm };
			rw_executor<booster::shared_mutex> exec3 = { flags + 2, true, &fm, &sm };
			booster::thread t1(exec1);
			booster::thread t2(exec2);
			booster::thread t3(exec3);

			for(int i=0;i<100;i++) {
				booster::ptime::millisleep(1);
				{
					booster::unique_lock<booster::mutex> l(fm);
					if(flags[0] && flags[1])
						mread_happened = true;
					if(flags[2])
						write_happened = true;
					if((flags[0] || flags[1]) && flags[2])
						error_occured = true;
				}
			}

			t1.join();
			t2.join();
			t3.join();

			TEST(mread_happened);
			TEST(write_happened);
			TEST(error_occured);
		}
		std::cout << "Test recursive_shared_mutex shared/write lock" << std::endl;
		{
			booster::mutex fm;
			booster::recursive_shared_mutex sm;
			bool flags[3] = {false,false,false};
			bool mread_happened  = false;
			bool write_happened = false;
			bool error_occured = false ;
			rw_executor<booster::recursive_shared_mutex> exec1 = { flags + 0, true, &fm, &sm };
			rw_executor<booster::recursive_shared_mutex> exec2 = { flags + 1, true, &fm, &sm };
			rw_executor<booster::recursive_shared_mutex> exec3 = { flags + 2, true, &fm, &sm };
			booster::thread t1(exec1);
			booster::thread t2(exec2);
			booster::thread t3(exec3);

			for(int i=0;i<100;i++) {
				booster::ptime::millisleep(1);
				{
					booster::unique_lock<booster::mutex> l(fm);
					if(flags[0] && flags[1])
						mread_happened = true;
					if(flags[2])
						write_happened = true;
					if((flags[0] || flags[1]) && flags[2])
						error_occured = true;
				}
			}

			t1.join();
			t2.join();
			t3.join();

			TEST(mread_happened);
			TEST(write_happened);
			TEST(error_occured);
		}
		std::cout << "Test recursive_shared_mutex recursive shared lock" << std::endl;
		{
			booster::recursive_shared_mutex l;
			bool read  = false;
			bool write = false;
			rw_shared_thread t1c = { &l, &read };
			rw_unique_thread t2c = { &l, &write };
			booster::thread t1(t1c);
			booster::thread t2(t2c);
			t1.join();
			t2.join();
			TEST(read);
			TEST(write);
		}

}
	catch(std::exception const &e)
	{
		std::cerr << "Fail:" <<e.what();
		return EXIT_FAILURE;
	}
	std::cout << "Ok" << std::endl;
	return EXIT_SUCCESS;
	
}